

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O1

void __thiscall
OpenMPToClause::generateDOT
          (OpenMPToClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long *plVar9;
  undefined8 *puVar10;
  size_t sVar11;
  long *plVar12;
  ulong *puVar13;
  size_type *psVar14;
  ulong uVar15;
  pointer ppcVar16;
  undefined8 uVar17;
  uint uVar18;
  uint uVar19;
  string __str_1;
  string __str_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  string __str;
  string mapper_identifier;
  string parameter_string;
  string current_line;
  string indent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string clause_kind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8;
  undefined8 uStack_1b0;
  ofstream *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  ulong *local_160;
  long local_158;
  ulong local_150;
  long lStack_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  char *local_120;
  undefined8 local_118;
  char local_110;
  undefined7 uStack_10f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator<char> local_b9;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  OpenMPToClause *local_38;
  
  local_120 = &local_110;
  local_118 = 0;
  local_110 = '\0';
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_1a8 = dot_file;
  local_38 = this;
  std::__cxx11::string::_M_construct((ulong)&local_e0,(char)depth);
  uVar19 = -depth;
  if (0 < depth) {
    uVar19 = depth;
  }
  uVar18 = 1;
  if (9 < uVar19) {
    uVar15 = (ulong)uVar19;
    uVar6 = 4;
    do {
      uVar18 = uVar6;
      uVar8 = (uint)uVar15;
      if (uVar8 < 100) {
        uVar18 = uVar18 - 2;
        goto LAB_00146550;
      }
      if (uVar8 < 1000) {
        uVar18 = uVar18 - 1;
        goto LAB_00146550;
      }
      if (uVar8 < 10000) goto LAB_00146550;
      uVar15 = uVar15 / 10000;
      uVar6 = uVar18 + 4;
    } while (99999 < uVar8);
    uVar18 = uVar18 + 1;
  }
LAB_00146550:
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1a0,(char)uVar18 - (char)(depth >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_1a0._M_dataplus._M_p + ((uint)depth >> 0x1f),uVar18,uVar19);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,0x1a7eb7);
  plVar12 = plVar9 + 2;
  if ((long *)*plVar9 == plVar12) {
    local_170 = *plVar12;
    lStack_168 = plVar9[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *plVar12;
    local_180 = (long *)*plVar9;
  }
  local_178 = plVar9[1];
  *plVar9 = (long)plVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_180);
  puVar13 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar13) {
    local_150 = *puVar13;
    lStack_148 = plVar9[3];
    local_160 = &local_150;
  }
  else {
    local_150 = *puVar13;
    local_160 = (ulong *)*plVar9;
  }
  local_158 = plVar9[1];
  *plVar9 = (long)puVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  uVar19 = -index;
  if (0 < index) {
    uVar19 = index;
  }
  uVar18 = 1;
  if (9 < uVar19) {
    uVar15 = (ulong)uVar19;
    uVar6 = 4;
    do {
      uVar18 = uVar6;
      uVar8 = (uint)uVar15;
      if (uVar8 < 100) {
        uVar18 = uVar18 - 2;
        goto LAB_001466b2;
      }
      if (uVar8 < 1000) {
        uVar18 = uVar18 - 1;
        goto LAB_001466b2;
      }
      if (uVar8 < 10000) goto LAB_001466b2;
      uVar15 = uVar15 / 10000;
      uVar6 = uVar18 + 4;
    } while (99999 < uVar8);
    uVar18 = uVar18 + 1;
  }
LAB_001466b2:
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_208,(char)uVar18 - (char)(index >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_208._M_dataplus._M_p + ((uint)index >> 0x1f),uVar18,uVar19);
  uVar15 = 0xf;
  if (local_160 != &local_150) {
    uVar15 = local_150;
  }
  paVar1 = &local_1a0.field_2;
  paVar2 = &local_208.field_2;
  if (uVar15 < local_208._M_string_length + local_158) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar2) {
      uVar17 = local_208.field_2._M_allocated_capacity;
    }
    if (local_208._M_string_length + local_158 <= (ulong)uVar17) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_160);
      goto LAB_0014674f;
    }
  }
  puVar10 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_208._M_dataplus._M_p);
LAB_0014674f:
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  psVar14 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_78.field_2._M_allocated_capacity = *psVar14;
    local_78.field_2._8_8_ = puVar10[3];
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar14;
    local_78._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_78._M_string_length = puVar10[1];
  *puVar10 = psVar14;
  puVar10[1] = 0;
  *(undefined1 *)psVar14 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_208,&local_e0,parent_node);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_208);
  puVar13 = (ulong *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_1a0.field_2._M_allocated_capacity = *puVar13;
    local_1a0.field_2._8_8_ = plVar9[3];
    local_1a0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1a0.field_2._M_allocated_capacity = *puVar13;
    local_1a0._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_1a0._M_string_length = plVar9[1];
  *plVar9 = (long)puVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1a0,(ulong)local_78._M_dataplus._M_p);
  plVar12 = plVar9 + 2;
  if ((long *)*plVar9 == plVar12) {
    local_170 = *plVar12;
    lStack_168 = plVar9[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *plVar12;
    local_180 = (long *)*plVar9;
  }
  local_178 = plVar9[1];
  *plVar9 = (long)plVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_180);
  puVar13 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar13) {
    local_150 = *puVar13;
    lStack_148 = plVar9[3];
    local_160 = &local_150;
  }
  else {
    local_150 = *puVar13;
    local_160 = (ulong *)*plVar9;
  }
  local_158 = plVar9[1];
  *plVar9 = (long)puVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_120,(string *)&local_160);
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = local_120;
  if (local_120 == (char *)0x0) {
    std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(*(long *)local_1a8 + -0x18));
  }
  else {
    sVar11 = strlen(local_120);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar11);
  }
  std::__cxx11::string::append((char *)&local_e0);
  local_158 = 0;
  local_150 = local_150 & 0xffffffffffffff00;
  local_160 = &local_150;
  if (local_38->to_kind == OMPC_TO_mapper) {
    std::__cxx11::string::_M_replace((ulong)&local_160,0,(char *)0x0,0x1a99e4);
  }
  if (local_158 != 0) {
    local_180 = &local_170;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_180,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    std::__cxx11::string::append((char *)&local_180);
    std::operator+(&local_1e8,&local_e0,&local_78);
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
    puVar13 = puVar10 + 2;
    if ((ulong *)*puVar10 == puVar13) {
      local_1b8 = *puVar13;
      uStack_1b0 = puVar10[3];
      local_1c8 = &local_1b8;
    }
    else {
      local_1b8 = *puVar13;
      local_1c8 = (ulong *)*puVar10;
    }
    local_1c0 = puVar10[1];
    *puVar10 = puVar13;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_180);
    psVar14 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_208.field_2._M_allocated_capacity = *psVar14;
      local_208.field_2._8_8_ = plVar9[3];
      local_208._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_208.field_2._M_allocated_capacity = *psVar14;
      local_208._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_208._M_string_length = plVar9[1];
    *plVar9 = (long)psVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_208);
    psVar14 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_1a0.field_2._M_allocated_capacity = *psVar14;
      local_1a0.field_2._8_8_ = plVar9[3];
      local_1a0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1a0.field_2._M_allocated_capacity = *psVar14;
      local_1a0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_1a0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_120,(string *)&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
    paVar1 = &local_1e8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    pcVar5 = local_120;
    if (local_120 == (char *)0x0) {
      std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(*(long *)local_1a8 + -0x18));
    }
    else {
      sVar11 = strlen(local_120);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar11);
    }
    local_b8 = &local_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_e0._M_dataplus._M_p,
               local_e0._M_dataplus._M_p + local_e0._M_string_length);
    std::__cxx11::string::append((char *)&local_b8);
    plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_180);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    psVar14 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_100.field_2._M_allocated_capacity = *psVar14;
      local_100.field_2._8_8_ = plVar9[3];
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar14;
      local_100._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_100._M_string_length = plVar9[1];
    *plVar9 = (long)psVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_100);
    psVar14 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_140.field_2._M_allocated_capacity = *psVar14;
      local_140.field_2._8_8_ = plVar9[3];
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar14;
      local_140._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_140._M_string_length = plVar9[1];
    *plVar9 = (long)psVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_180);
    puVar13 = (ulong *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_1e8.field_2._M_allocated_capacity = *puVar13;
      local_1e8.field_2._8_8_ = plVar9[3];
      local_1e8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *puVar13;
      local_1e8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_1e8._M_string_length = plVar9[1];
    *plVar9 = (long)puVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
    puVar13 = puVar10 + 2;
    if ((ulong *)*puVar10 == puVar13) {
      local_1b8 = *puVar13;
      uStack_1b0 = puVar10[3];
      local_1c8 = &local_1b8;
    }
    else {
      local_1b8 = *puVar13;
      local_1c8 = (ulong *)*puVar10;
    }
    local_1c0 = puVar10[1];
    *puVar10 = puVar13;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_160);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    puVar13 = (ulong *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_208.field_2._M_allocated_capacity = *puVar13;
      local_208.field_2._8_8_ = plVar9[3];
    }
    else {
      local_208.field_2._M_allocated_capacity = *puVar13;
      local_208._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_208._M_string_length = plVar9[1];
    *plVar9 = (long)puVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_208);
    puVar13 = (ulong *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_1a0.field_2._M_allocated_capacity = *puVar13;
      local_1a0.field_2._8_8_ = plVar9[3];
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    }
    else {
      local_1a0.field_2._M_allocated_capacity = *puVar13;
      local_1a0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_1a0._M_string_length = plVar9[1];
    *plVar9 = (long)puVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_120,(string *)&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    pcVar5 = local_120;
    if (local_120 == (char *)0x0) {
      std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(*(long *)local_1a8 + -0x18));
    }
    else {
      sVar11 = strlen(local_120);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar11);
    }
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
  }
  local_180 = &local_170;
  pcVar4 = (local_38->mapper_identifier)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,pcVar4,pcVar4 + (local_38->mapper_identifier)._M_string_length);
  iVar7 = std::__cxx11::string::compare((char *)&local_180);
  if (iVar7 != 0) {
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a0,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    std::__cxx11::string::append((char *)&local_1a0);
    std::__cxx11::string::_M_assign((string *)&local_160);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    std::__cxx11::string::append((char *)&local_208);
    std::operator+(&local_100,&local_e0,&local_1a0);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_100);
    paVar1 = &local_140.field_2;
    psVar14 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_140.field_2._M_allocated_capacity = *psVar14;
      local_140.field_2._8_8_ = plVar9[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar14;
      local_140._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_140._M_string_length = plVar9[1];
    *plVar9 = (long)psVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_140,(ulong)local_208._M_dataplus._M_p);
    paVar2 = &local_1e8.field_2;
    psVar14 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_1e8.field_2._M_allocated_capacity = *psVar14;
      local_1e8.field_2._8_8_ = plVar9[3];
      local_1e8._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar14;
      local_1e8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_1e8._M_string_length = plVar9[1];
    *plVar9 = (long)psVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
    puVar13 = puVar10 + 2;
    if ((ulong *)*puVar10 == puVar13) {
      local_1b8 = *puVar13;
      uStack_1b0 = puVar10[3];
      local_1c8 = &local_1b8;
    }
    else {
      local_1b8 = *puVar13;
      local_1c8 = (ulong *)*puVar10;
    }
    local_1c0 = puVar10[1];
    *puVar10 = puVar13;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_120,(string *)&local_1c8);
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    paVar3 = &local_100.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar3) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    pcVar5 = local_120;
    if (local_120 == (char *)0x0) {
      std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(*(long *)local_1a8 + -0x18));
    }
    else {
      sVar11 = strlen(local_120);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar11);
    }
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_e0._M_dataplus._M_p,
               local_e0._M_dataplus._M_p + local_e0._M_string_length);
    std::__cxx11::string::append((char *)&local_98);
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_98,(ulong)local_208._M_dataplus._M_p);
    local_58 = &local_48;
    plVar12 = plVar9 + 2;
    if ((long *)*plVar9 == plVar12) {
      local_48 = *plVar12;
      lStack_40 = plVar9[3];
    }
    else {
      local_48 = *plVar12;
      local_58 = (long *)*plVar9;
    }
    local_50 = plVar9[1];
    *plVar9 = (long)plVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_58);
    plVar12 = plVar9 + 2;
    if ((long *)*plVar9 == plVar12) {
      local_a8 = *plVar12;
      lStack_a0 = plVar9[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar12;
      local_b8 = (long *)*plVar9;
    }
    local_b0 = plVar9[1];
    *plVar9 = (long)plVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_b8,(ulong)local_208._M_dataplus._M_p);
    psVar14 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_100.field_2._M_allocated_capacity = *psVar14;
      local_100.field_2._8_8_ = plVar9[3];
      local_100._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar14;
      local_100._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_100._M_string_length = plVar9[1];
    *plVar9 = (long)psVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_100);
    psVar14 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_140.field_2._M_allocated_capacity = *psVar14;
      local_140.field_2._8_8_ = plVar9[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar14;
      local_140._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_140._M_string_length = plVar9[1];
    *plVar9 = (long)psVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_160);
    puVar13 = (ulong *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_1e8.field_2._M_allocated_capacity = *puVar13;
      local_1e8.field_2._8_8_ = plVar9[3];
      local_1e8._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *puVar13;
      local_1e8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_1e8._M_string_length = plVar9[1];
    *plVar9 = (long)puVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
    puVar13 = puVar10 + 2;
    if ((ulong *)*puVar10 == puVar13) {
      local_1b8 = *puVar13;
      uStack_1b0 = puVar10[3];
      local_1c8 = &local_1b8;
    }
    else {
      local_1b8 = *puVar13;
      local_1c8 = (ulong *)*puVar10;
    }
    local_1c0 = puVar10[1];
    *puVar10 = puVar13;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_120,(string *)&local_1c8);
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar3) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_58 != &local_48) {
      operator_delete(local_58,local_48 + 1);
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
    pcVar5 = local_120;
    if (local_120 == (char *)0x0) {
      std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(*(long *)local_1a8 + -0x18));
    }
    else {
      sVar11 = strlen(local_120);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar11);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
  }
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  local_1a0._M_string_length = 0;
  local_1a0.field_2._M_allocated_capacity =
       local_1a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  ppcVar16 = (local_38->super_OpenMPClause).expressions.
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppcVar16 !=
      (local_38->super_OpenMPClause).expressions.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar1 = &local_1e8.field_2;
    uVar19 = 0;
    do {
      local_1c8 = &local_1b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
      std::__cxx11::string::append((char *)&local_1c8);
      uVar18 = 1;
      if (9 < uVar19) {
        uVar15 = (ulong)uVar19;
        uVar6 = 4;
        do {
          uVar18 = uVar6;
          uVar8 = (uint)uVar15;
          if (uVar8 < 100) {
            uVar18 = uVar18 - 2;
            goto LAB_0014774e;
          }
          if (uVar8 < 1000) {
            uVar18 = uVar18 - 1;
            goto LAB_0014774e;
          }
          if (uVar8 < 10000) goto LAB_0014774e;
          uVar15 = uVar15 / 10000;
          uVar6 = uVar18 + 4;
        } while (99999 < uVar8);
        uVar18 = uVar18 + 1;
      }
LAB_0014774e:
      local_1e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&local_1e8,(char)uVar18);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_1e8._M_dataplus._M_p,uVar18,uVar19);
      uVar15 = 0xf;
      if (local_1c8 != &local_1b8) {
        uVar15 = local_1b8;
      }
      paVar2 = &local_208.field_2;
      if (uVar15 < local_1e8._M_string_length + local_1c0) {
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != paVar1) {
          uVar17 = local_1e8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < local_1e8._M_string_length + local_1c0) goto LAB_001477b5;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_1c8);
      }
      else {
LAB_001477b5:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_1c8,(ulong)local_1e8._M_dataplus._M_p);
      }
      psVar14 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_208.field_2._M_allocated_capacity = *psVar14;
        local_208.field_2._8_8_ = puVar10[3];
        local_208._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_208.field_2._M_allocated_capacity = *psVar14;
        local_208._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_208._M_string_length = puVar10[1];
      *puVar10 = psVar14;
      puVar10[1] = 0;
      *(undefined1 *)psVar14 = 0;
      std::__cxx11::string::operator=((string *)&local_1a0,(string *)&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8,local_1b8 + 1);
      }
      std::operator+(&local_140,&local_e0,&local_78);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_140);
      psVar14 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_1e8.field_2._M_allocated_capacity = *psVar14;
        local_1e8.field_2._8_8_ = plVar9[3];
        local_1e8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_1e8.field_2._M_allocated_capacity = *psVar14;
        local_1e8._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_1e8._M_string_length = plVar9[1];
      *plVar9 = (long)psVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_1e8,(ulong)local_1a0._M_dataplus._M_p);
      puVar13 = puVar10 + 2;
      if ((ulong *)*puVar10 == puVar13) {
        local_1b8 = *puVar13;
        uStack_1b0 = puVar10[3];
        local_1c8 = &local_1b8;
      }
      else {
        local_1b8 = *puVar13;
        local_1c8 = (ulong *)*puVar10;
      }
      local_1c0 = puVar10[1];
      *puVar10 = puVar13;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_1c8);
      psVar14 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_208.field_2._M_allocated_capacity = *psVar14;
        local_208.field_2._8_8_ = plVar9[3];
        local_208._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_208.field_2._M_allocated_capacity = *psVar14;
        local_208._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_208._M_string_length = plVar9[1];
      *plVar9 = (long)psVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_120,(string *)&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8,local_1b8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      pcVar5 = local_120;
      if (local_120 == (char *)0x0) {
        std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(*(long *)local_1a8 + -0x18));
      }
      else {
        sVar11 = strlen(local_120);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar11);
      }
      local_58 = &local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,local_e0._M_dataplus._M_p,
                 local_e0._M_dataplus._M_p + local_e0._M_string_length);
      std::__cxx11::string::append((char *)&local_58);
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_58,(ulong)local_1a0._M_dataplus._M_p);
      local_b8 = &local_a8;
      plVar12 = plVar9 + 2;
      if ((long *)*plVar9 == plVar12) {
        local_a8 = *plVar12;
        lStack_a0 = plVar9[3];
      }
      else {
        local_a8 = *plVar12;
        local_b8 = (long *)*plVar9;
      }
      local_b0 = plVar9[1];
      *plVar9 = (long)plVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      psVar14 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_100.field_2._M_allocated_capacity = *psVar14;
        local_100.field_2._8_8_ = plVar9[3];
      }
      else {
        local_100.field_2._M_allocated_capacity = *psVar14;
        local_100._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_100._M_string_length = plVar9[1];
      *plVar9 = (long)psVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_100,(ulong)local_1a0._M_dataplus._M_p);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      psVar14 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_140.field_2._M_allocated_capacity = *psVar14;
        local_140.field_2._8_8_ = plVar9[3];
      }
      else {
        local_140.field_2._M_allocated_capacity = *psVar14;
        local_140._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_140._M_string_length = plVar9[1];
      *plVar9 = (long)psVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_140);
      puVar13 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_1e8.field_2._M_allocated_capacity = *puVar13;
        local_1e8.field_2._8_8_ = plVar9[3];
        local_1e8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_1e8.field_2._M_allocated_capacity = *puVar13;
        local_1e8._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_1e8._M_string_length = plVar9[1];
      *plVar9 = (long)puVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,*ppcVar16,&local_b9);
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar1) {
        uVar17 = local_1e8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_90 + local_1e8._M_string_length) {
        uVar15 = 0xf;
        if (local_98 != local_88) {
          uVar15 = local_88[0];
        }
        if (uVar15 < local_90 + local_1e8._M_string_length) goto LAB_00147c7e;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_98,0,(char *)0x0,(ulong)local_1e8._M_dataplus._M_p);
      }
      else {
LAB_00147c7e:
        puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_98);
      }
      puVar13 = puVar10 + 2;
      if ((ulong *)*puVar10 == puVar13) {
        local_1b8 = *puVar13;
        uStack_1b0 = puVar10[3];
        local_1c8 = &local_1b8;
      }
      else {
        local_1b8 = *puVar13;
        local_1c8 = (ulong *)*puVar10;
      }
      local_1c0 = puVar10[1];
      *puVar10 = puVar13;
      puVar10[1] = 0;
      *(undefined1 *)puVar13 = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_1c8);
      puVar13 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_208.field_2._M_allocated_capacity = *puVar13;
        local_208.field_2._8_8_ = plVar9[3];
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      }
      else {
        local_208.field_2._M_allocated_capacity = *puVar13;
        local_208._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_208._M_string_length = plVar9[1];
      *plVar9 = (long)puVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_120,(string *)&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8,local_1b8 + 1);
      }
      if (local_98 != local_88) {
        operator_delete(local_98,local_88[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_58 != &local_48) {
        operator_delete(local_58,local_48 + 1);
      }
      pcVar5 = local_120;
      if (local_120 == (char *)0x0) {
        std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(*(long *)local_1a8 + -0x18));
      }
      else {
        sVar11 = strlen(local_120);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar11);
      }
      uVar19 = uVar19 + 1;
      ppcVar16 = ppcVar16 + 1;
    } while (ppcVar16 !=
             (local_38->super_OpenMPClause).expressions.
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
  }
  return;
}

Assistant:

void OpenMPToClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "to_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    OpenMPToClauseKind kind = this->getKind();
    std::string parameter_string;
    switch (kind) {
        case OMPC_TO_mapper:
            parameter_string = "mapper";
            break;
        default:
            ;
    };

    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_kind";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };
    std::string mapper_identifier = this->getMapperIdentifier();
    if (mapper_identifier != "") {
    std::string node_id =  clause_kind+ "_kind";
        parameter_string = mapper_identifier;
        std::string mapper_identifier_name = clause_kind + "_mapper_identifier";
        current_line = indent + node_id + " -- " + mapper_identifier_name + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + mapper_identifier_name + " [label = \"" + mapper_identifier_name + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };    


 std::vector<const char*>* expr = this->getExpressions();
    if (expr != NULL) {
        std::vector<const char*>::iterator it;
        int expr_index = 0;
        std::string expr_name;
        for (it = expr->begin(); it != expr->end(); it++) {
            expr_name = clause_kind + "_expr" + std::to_string(expr_index);
            expr_index += 1;
            current_line = indent + clause_kind + " -- " + expr_name + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*it) + "\"]\n";
            dot_file << current_line.c_str();
        };
    };

}